

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O2

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::clear
          (image<crnlib::color_quad<unsigned_char,_int>_> *this)

{
  this->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  vector<crnlib::color_quad<unsigned_char,_int>_>::clear(&this->m_pixel_buf);
  this->m_width = 0;
  this->m_height = 0;
  this->m_pitch = 0;
  this->m_total = 0;
  this->m_comp_flags = 0xf;
  return;
}

Assistant:

void clear()
        {
            m_pPixels = nullptr;
            m_pixel_buf.clear();
            m_width = 0;
            m_height = 0;
            m_pitch = 0;
            m_total = 0;
            m_comp_flags = pixel_format_helpers::cDefaultCompFlags;
        }